

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

double ImGui::RoundScalarWithFormatT<double>(char *format,ImGuiDataType data_type,double v)

{
  char *pcVar1;
  byte bVar2;
  byte *in_RAX;
  byte *pbVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  char *__nptr;
  char fmt_sanitized [32];
  char v_str [64];
  byte local_68 [31];
  char local_49;
  char local_48 [64];
  
  do {
    bVar2 = *format;
    if (bVar2 == 0) {
      iVar4 = 3;
      pbVar5 = in_RAX;
    }
    else if ((bVar2 != 0x25) || (iVar4 = 1, pbVar5 = (byte *)format, ((byte *)format)[1] == 0x25)) {
      format = (char *)((byte *)format + (ulong)(bVar2 == 0x25) + 1);
      iVar4 = 0;
      pbVar5 = in_RAX;
    }
    in_RAX = pbVar5;
  } while (iVar4 == 0);
  if (iVar4 == 1) {
    format = (char *)pbVar5;
  }
  if ((*format == 0x25) && (((byte *)format)[1] != 0x25)) {
    pbVar3 = (byte *)ImParseFormatFindEnd(format);
    pbVar5 = local_68;
    if (format < pbVar3) {
      do {
        uVar6 = (byte)*format - 0x24;
        if ((0x3b < uVar6) || ((0x800000000000009U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
          *pbVar5 = *format;
          pbVar5 = pbVar5 + 1;
        }
        format = (char *)((byte *)format + 1);
      } while ((byte *)format != pbVar3);
    }
    *pbVar5 = 0;
    ImFormatString(local_48,0x40,(char *)local_68,v);
    __nptr = &local_49;
    do {
      pcVar1 = __nptr + 1;
      __nptr = __nptr + 1;
    } while (*pcVar1 == ' ');
    v = atof(__nptr);
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    IM_UNUSED(data_type);
    IM_ASSERT(data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    ImParseFormatSanitizeForPrinting(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    v = (TYPE)ImAtof(p);

    return v;
}